

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble * trng::math::detail::mln1p<long_double>(longdouble x)

{
  int iVar1;
  undefined4 extraout_var;
  longdouble *plVar2;
  int in_EDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar3;
  longdouble in_ST6;
  longdouble in_stack_00000008;
  longdouble delta;
  int n;
  longdouble sign;
  longdouble x_to_the_n;
  longdouble y;
  undefined8 in_stack_ffffffffffffff62;
  uint local_5c;
  longdouble local_58;
  longdouble local_48;
  longdouble local_38;
  
  iVar1 = std::abs(in_EDI);
  plVar2 = (longdouble *)CONCAT44(extraout_var,iVar1);
  if (in_ST0 < (longdouble)0.03125) {
    local_38 = (longdouble)0;
    local_48 = in_stack_00000008 * in_stack_00000008;
    local_58 = (longdouble)1;
    local_5c = 2;
    while ((int)local_5c < 0x40) {
      local_38 = local_38 + (local_48 * local_58) / (longdouble)(int)local_5c;
      lVar3 = in_ST6;
      std::abs(in_EDI);
      plVar2 = std::numeric_limits<long_double>::epsilon();
      if (in_ST1 < local_38 * (longdouble)4.0 * in_ST2) {
        return plVar2;
      }
      local_48 = local_48 * in_stack_00000008;
      local_58 = -local_58;
      local_5c = local_5c + 1;
      plVar2 = (longdouble *)(ulong)local_5c;
      in_ST1 = in_ST3;
      in_ST2 = in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = in_ST6;
      in_ST5 = lVar3;
      in_ST6 = lVar3;
    }
  }
  else {
    plVar2 = ln1p((longdouble)
                  CONCAT82(in_stack_ffffffffffffff62,(short)((unkuint10)in_stack_00000008 >> 0x40)))
    ;
  }
  return plVar2;
}

Assistant:

TRNG_CUDA_ENABLE T mln1p(T x) {
        if (abs(x) >= T(1) / T(32))
          return x - ln1p(x);
        // use Taylor expansion for small arguments
        T y{0};
        T x_to_the_n{x * x};
        T sign{1};
        for (int n{2}; n < numeric_limits<T>::digits; ++n) {
          const T delta{sign * x_to_the_n / n};
          y += delta;
          if (abs(delta) < 4 * numeric_limits<T>::epsilon() * y)
            break;
          x_to_the_n *= x;
          sign = -sign;
        }
        return y;
      }